

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O1

ps_mgau_t * ptm_mgau_init(acmod_t *acmod,bin_mdef_t *mdef)

{
  uint uVar1;
  uint uVar2;
  feat_t *pfVar3;
  int iVar4;
  ptm_mgau_t *s;
  logmath_t *plVar5;
  char *pcVar6;
  char *varfile;
  gauden_t *pgVar7;
  uint8 *puVar8;
  ptm_fast_eval_t *ppVar9;
  uint uVar10;
  long lVar11;
  uint32 *puVar12;
  err_lvl_t lvl;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float64 base;
  double dVar16;
  
  s = (ptm_mgau_t *)
      __ckd_calloc__(1,0x78,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                     ,0x325);
  s->config = acmod->config;
  plVar5 = logmath_retain(acmod->lmath);
  s->lmath = plVar5;
  base = logmath_get_base(acmod->lmath);
  plVar5 = logmath_init(base,10,1);
  s->lmath_8b = plVar5;
  if (plVar5 != (logmath_t *)0x0) {
    iVar4 = logmath_get_width(plVar5);
    if (iVar4 == 1) {
      pcVar6 = ps_config_str(s->config,"mean");
      varfile = ps_config_str(s->config,"var");
      dVar16 = ps_config_float(s->config,"varfloor");
      pgVar7 = gauden_init(pcVar6,varfile,(float32)(float)dVar16,s->lmath);
      s->g = pgVar7;
      if (pgVar7 == (gauden_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x339,"Failed to read means and variances\n");
      }
      else {
        uVar1 = pgVar7->n_mgau;
        uVar13 = (ulong)uVar1;
        if ((int)uVar1 < 0x101) {
          uVar14 = (ulong)(uint)mdef->n_ciphone;
          if (uVar1 == mdef->n_ciphone) {
            uVar1 = pgVar7->n_feat;
            uVar13 = (ulong)uVar1;
            pfVar3 = acmod->fcb;
            uVar2 = pfVar3->n_sv;
            uVar10 = uVar2;
            if (uVar2 == 0) {
              uVar10 = pfVar3->n_stream;
            }
            if (uVar1 == uVar10) {
              if (0 < (int)uVar1) {
                lVar11 = 0;
                lVar15 = 0;
                do {
                  puVar12 = &pfVar3->out_dim;
                  if (pfVar3->lda == (mfcc_t ***)0x0) {
                    if (pfVar3->sv_len == (uint32 *)0x0) {
                      puVar12 = (uint32 *)((long)pfVar3->stream_len + lVar11);
                    }
                    else {
                      puVar12 = pfVar3->sv_len + lVar15;
                    }
                  }
                  uVar1 = *(uint *)((long)pgVar7->featlen + lVar11);
                  if (uVar1 != *puVar12) {
                    if (pfVar3->lda == (mfcc_t ***)0x0) {
                      if (pfVar3->sv_len == (uint32 *)0x0) {
                        puVar12 = (uint32 *)(lVar11 + (long)pfVar3->stream_len);
                      }
                      else {
                        puVar12 = (uint32 *)((long)pfVar3->sv_len + lVar11);
                      }
                    }
                    else {
                      puVar12 = &pfVar3->out_dim;
                    }
                    uVar14 = (ulong)*puVar12;
                    pcVar6 = "Dimension of stream %d does not match: %d != %d\n";
                    lVar11 = 0x350;
                    lvl = ERR_ERROR;
                    uVar13 = (ulong)uVar1;
                    goto LAB_0013d850;
                  }
                  lVar15 = lVar15 + 1;
                  lVar11 = lVar11 + 4;
                } while (uVar13 << 2 != lVar11);
              }
              pcVar6 = ps_config_str(s->config,"sendump");
              if (pcVar6 == (char *)0x0) {
                pcVar6 = ps_config_str(s->config,"mixw");
                dVar16 = ps_config_float(s->config,"mixwfloor");
                iVar4 = read_mixw(s,pcVar6,dVar16);
              }
              else {
                iVar4 = read_sendump(s,acmod->mdef,pcVar6);
              }
              if (-1 < iVar4) {
                lVar11 = ps_config_int(s->config,"ds");
                s->ds_ratio = (int16)lVar11;
                lVar11 = ps_config_int(s->config,"topn");
                s->max_topn = (short)lVar11;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x362,"Maximum top-N: %d\n",(ulong)(uint)(int)(short)lVar11);
                puVar8 = (uint8 *)__ckd_calloc__((long)s->n_sen,1,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                                 ,0x366);
                s->sen2cb = puVar8;
                if (0 < s->n_sen) {
                  lVar11 = 0;
                  do {
                    s->sen2cb[lVar11] = (uint8)acmod->mdef->sen2cimap[lVar11];
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < s->n_sen);
                }
                lVar11 = ps_config_int(s->config,"pl_window");
                iVar4 = (int)lVar11 + 2;
                s->n_fast_hist = iVar4;
                ppVar9 = (ptm_fast_eval_t *)
                         __ckd_calloc__((long)iVar4,0x10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                        ,0x36e);
                s->hist = ppVar9;
                s->f = ppVar9;
                ptm_mgau_reset_fast_hist((ps_mgau_t *)s);
                (s->base).vt = &ptm_mgau_funcs;
                return &s->base;
              }
              goto LAB_0013d857;
            }
            if (uVar2 == 0) {
              uVar2 = pfVar3->n_stream;
            }
            uVar14 = (ulong)uVar2;
            pcVar6 = "Number of streams does not match: %d != %d\n";
            lVar11 = 0x34a;
            lvl = ERR_ERROR;
          }
          else {
            pcVar6 = 
            "Number of codebooks doesn\'t match number of ciphones, doesn\'t look like PTM: %d != %d\n"
            ;
            lVar11 = 0x344;
            lvl = ERR_INFO;
          }
LAB_0013d850:
          err_msg(lvl,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                  ,lVar11,pcVar6,uVar13,uVar14);
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                  ,0x340,"Number of codebooks exceeds 256: %d\n");
        }
      }
    }
    else {
      logmath_get_base(s->lmath_8b);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
              ,0x330,"Log base %f is too small to represent add table in 8 bits\n");
    }
  }
LAB_0013d857:
  ptm_mgau_free((ps_mgau_t *)s);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
ptm_mgau_init(acmod_t *acmod, bin_mdef_t *mdef)
{
    ptm_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* We only support 256 codebooks or less (like 640k or 2GB, this
     * should be enough for anyone) */
    if (s->g->n_mgau > 256) {
        E_INFO("Number of codebooks exceeds 256: %d\n", s->g->n_mgau);
        goto error_out;
    }
    if (s->g->n_mgau != bin_mdef_n_ciphone(mdef)) {
        E_INFO("Number of codebooks doesn't match number of ciphones, doesn't look like PTM: %d != %d\n", s->g->n_mgau, bin_mdef_n_ciphone(mdef));
        goto error_out;
    }
    /* Verify n_feat and veclen, against acmod. */
    if (s->g->n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                s->g->n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < s->g->n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights. */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");
    s->max_topn = ps_config_int(s->config, "topn");
    E_INFO("Maximum top-N: %d\n", s->max_topn);

    /* Assume mapping of senones to their base phones, though this
     * will become more flexible in the future. */
    s->sen2cb = ckd_calloc(s->n_sen, sizeof(*s->sen2cb));
    for (i = 0; i < s->n_sen; ++i)
        s->sen2cb[i] = bin_mdef_sen2cimap(acmod->mdef, i);

    /* Allocate fast-match history buffers.  We need enough for the
     * phoneme lookahead window, plus the current frame, plus one for
     * good measure? (FIXME: I don't remember why) */
    s->n_fast_hist = ps_config_int(s->config, "pl_window") + 2;
    s->hist = ckd_calloc(s->n_fast_hist, sizeof(*s->hist));
    /* s->f will be a rotating pointer into s->hist. */
    s->f = s->hist;

    ps = (ps_mgau_t *)s;
    ptm_mgau_reset_fast_hist(ps);
    ps->vt = &ptm_mgau_funcs;
    return ps;
error_out:
    ptm_mgau_free(ps_mgau_base(s));
    return NULL;
}